

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O1

void boost::unit_test::utils::print_escaped_cdata(ostream *where_to,const_string *value)

{
  long lVar1;
  ulong uVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  ulong uVar6;
  bool bVar7;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)::cdata_end ==
      '\0') {
    print_escaped_cdata();
  }
  lVar1 = -1;
  uVar2 = (long)print_escaped_cdata::cdata_end.m_end - (long)print_escaped_cdata::cdata_end.m_begin;
  if (uVar2 != 0) {
    pvVar3 = value->m_begin;
    if ((uVar2 <= (ulong)((long)value->m_end - (long)pvVar3)) &&
       (pvVar4 = value->m_end + -uVar2, pvVar3 != pvVar4 + 1)) {
      bVar7 = false;
      pvVar5 = pvVar3;
      if (uVar2 == 0) {
LAB_0017ff5c:
        if (!bVar7) {
          lVar1 = (long)pvVar5 - (long)pvVar3;
        }
      }
      else {
        do {
          uVar6 = 0;
          while (pvVar5[uVar6] == print_escaped_cdata::cdata_end.m_begin[uVar6]) {
            uVar6 = uVar6 + 1;
            if (uVar2 == uVar6) goto LAB_0017ff5c;
          }
          bVar7 = pvVar5 == pvVar4;
          pvVar5 = pvVar5 + 1;
        } while (!bVar7);
      }
    }
  }
  if (lVar1 == -1) {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,value->m_begin);
    std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
    if (local_48 == local_38) {
      return;
    }
  }
  else {
    uVar2 = lVar1 + 2;
    pvVar3 = value->m_begin;
    pvVar4 = pvVar3 + lVar1 + 2;
    if ((ulong)((long)value->m_end - (long)pvVar3) < uVar2) {
      pvVar4 = value->m_end;
    }
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pvVar3,pvVar4);
    std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,print_escaped_cdata::cdata_end.m_begin,
               print_escaped_cdata::cdata_end.m_end);
    std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<![CDATA[","");
    std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    pvVar4 = value->m_begin;
    uVar6 = (long)value->m_end - (long)pvVar4;
    pvVar3 = pvVar4 + uVar2;
    pvVar4 = pvVar4 + -1;
    if (uVar6 != 0xffffffffffffffff) {
      pvVar4 = value->m_end;
    }
    if (uVar6 < uVar2) {
      pvVar3 = "";
      pvVar4 = "";
    }
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pvVar3,pvVar4);
    std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
    if (local_48 == local_38) {
      return;
    }
  }
  operator_delete(local_48,local_38[0] + 1);
  return;
}

Assistant:

inline void
print_escaped_cdata( std::ostream& where_to, const_string value )
{
    static const_string cdata_end( "]]>" );

    const_string::size_type pos = value.find( cdata_end );
    if( pos == const_string::npos )
        where_to << value;
    else {
        where_to << value.substr( 0, pos+2 ) << cdata_end
                 << BOOST_TEST_L( "<![CDATA[" ) << value.substr( pos+2 );
    }
}